

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * get_D3D_register_string
                 (Context *ctx,RegisterType regtype,int regnum,char *regnum_str,size_t regnum_size)

{
  bool bVar1;
  int iVar2;
  char *pcStack_30;
  int has_number;
  char *retval;
  size_t regnum_size_local;
  char *regnum_str_local;
  int regnum_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  pcStack_30 = (char *)0x0;
  bVar1 = true;
  switch(regtype) {
  case REG_TYPE_TEMP:
    pcStack_30 = "r";
    break;
  case REG_TYPE_INPUT:
    pcStack_30 = "v";
    break;
  case REG_TYPE_CONST:
    pcStack_30 = "c";
    break;
  case REG_TYPE_ADDRESS:
    iVar2 = shader_is_vertex(ctx);
    pcStack_30 = "t";
    if (iVar2 != 0) {
      pcStack_30 = "a";
    }
    break;
  case REG_TYPE_RASTOUT:
    if (regnum == 0) {
      pcStack_30 = "oPos";
    }
    else if (regnum == 1) {
      pcStack_30 = "oFog";
    }
    else if (regnum == 2) {
      pcStack_30 = "oPts";
    }
    bVar1 = false;
    break;
  case REG_TYPE_ATTROUT:
    pcStack_30 = "oD";
    break;
  case REG_TYPE_OUTPUT:
    iVar2 = shader_is_vertex(ctx);
    if ((iVar2 == 0) || (iVar2 = shader_version_atleast(ctx,'\x03','\0'), iVar2 == 0)) {
      pcStack_30 = "oT";
    }
    else {
      pcStack_30 = "o";
    }
    break;
  case REG_TYPE_CONSTINT:
    pcStack_30 = "i";
    break;
  case REG_TYPE_COLOROUT:
    pcStack_30 = "oC";
    break;
  case REG_TYPE_DEPTHOUT:
    pcStack_30 = "oDepth";
    bVar1 = false;
    break;
  case REG_TYPE_SAMPLER:
    pcStack_30 = "s";
    break;
  default:
    fail(ctx,"unknown register type");
    pcStack_30 = "???";
    bVar1 = false;
    break;
  case REG_TYPE_CONSTBOOL:
    pcStack_30 = "b";
    break;
  case REG_TYPE_LOOP:
    pcStack_30 = "aL";
    bVar1 = false;
    break;
  case REG_TYPE_MISCTYPE:
    if (regnum == 0) {
      pcStack_30 = "vPos";
    }
    else if (regnum == 1) {
      pcStack_30 = "vFace";
    }
    bVar1 = false;
    break;
  case REG_TYPE_LABEL:
    pcStack_30 = "l";
    break;
  case REG_TYPE_MAX:
    pcStack_30 = "p";
  }
  if (bVar1) {
    snprintf(regnum_str,regnum_size,"%u",(ulong)(uint)regnum);
  }
  else {
    *regnum_str = '\0';
  }
  return pcStack_30;
}

Assistant:

static const char *get_D3D_register_string(Context *ctx,
                                           RegisterType regtype,
                                           int regnum, char *regnum_str,
                                           size_t regnum_size)
{
    const char *retval = NULL;
    int has_number = 1;

    switch (regtype)
    {
        case REG_TYPE_TEMP:
            retval = "r";
            break;

        case REG_TYPE_INPUT:
            retval = "v";
            break;

        case REG_TYPE_CONST:
            retval = "c";
            break;

        case REG_TYPE_ADDRESS:  // (or REG_TYPE_TEXTURE, same value.)
            retval = shader_is_vertex(ctx) ? "a" : "t";
            break;

        case REG_TYPE_RASTOUT:
            switch ((RastOutType) regnum)
            {
                case RASTOUT_TYPE_POSITION: retval = "oPos"; break;
                case RASTOUT_TYPE_FOG: retval = "oFog"; break;
                case RASTOUT_TYPE_POINT_SIZE: retval = "oPts"; break;
            } // switch
            has_number = 0;
            break;

        case REG_TYPE_ATTROUT:
            retval = "oD";
            break;

        case REG_TYPE_OUTPUT: // (or REG_TYPE_TEXCRDOUT, same value.)
            if (shader_is_vertex(ctx) && shader_version_atleast(ctx, 3, 0))
                retval = "o";
            else
                retval = "oT";
            break;

        case REG_TYPE_CONSTINT:
            retval = "i";
            break;

        case REG_TYPE_COLOROUT:
            retval = "oC";
            break;

        case REG_TYPE_DEPTHOUT:
            retval = "oDepth";
            has_number = 0;
            break;

        case REG_TYPE_SAMPLER:
            retval = "s";
            break;

        case REG_TYPE_CONSTBOOL:
            retval = "b";
            break;

        case REG_TYPE_LOOP:
            retval = "aL";
            has_number = 0;
            break;

        case REG_TYPE_MISCTYPE:
            switch ((const MiscTypeType) regnum)
            {
                case MISCTYPE_TYPE_POSITION: retval = "vPos"; break;
                case MISCTYPE_TYPE_FACE: retval = "vFace"; break;
            } // switch
            has_number = 0;
            break;

        case REG_TYPE_LABEL:
            retval = "l";
            break;

        case REG_TYPE_PREDICATE:
            retval = "p";
            break;

        //case REG_TYPE_TEMPFLOAT16:  // !!! FIXME: don't know this asm string
        default:
            fail(ctx, "unknown register type");
            retval = "???";
            has_number = 0;
            break;
    } // switch

    if (has_number)
        snprintf(regnum_str, regnum_size, "%u", (uint) regnum);
    else
        regnum_str[0] = '\0';

    return retval;
}